

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O3

void ExpReplay::end_pass(expreplay *er)

{
  single_learner *psVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar2 = er->N;
  if (uVar2 != 0) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      if (er->filled[uVar4] == true) {
        psVar1 = er->base;
        (**(code **)(psVar1 + 0x28))
                  (*(undefined8 *)(psVar1 + 0x18),*(undefined8 *)(psVar1 + 0x20),
                   (long)(er->buf->super_example_predict).feature_space + lVar3 + -0x20);
        er->filled[uVar4] = false;
        uVar2 = er->N;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x68d0;
    } while (uVar4 < uVar2);
  }
  return;
}

Assistant:

void end_pass(expreplay& er)
{  // we need to go through and learn on everyone who remains
  // also need to clean up remaining examples
  for (size_t n = 0; n < er.N; n++)
    if (er.filled[n])
    {  // TODO: if er.replay_count > 1 do we need to play these more?
      er.base->learn(er.buf[n]);
      er.filled[n] = false;
    }
}